

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O1

void __thiscall
enact::VariableTypename::VariableTypename(VariableTypename *this,VariableTypename *typename_)

{
  pointer pcVar1;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  line_t local_20;
  col_t local_1c;
  
  local_48._0_4_ = (typename_->m_identifier).type;
  pcVar1 = (typename_->m_identifier).lexeme._M_dataplus._M_p;
  local_40._M_p = (pointer)&local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (typename_->m_identifier).lexeme._M_string_length);
  local_1c = (typename_->m_identifier).col;
  local_20 = (typename_->m_identifier).line;
  VariableTypename(this,(Token *)local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

VariableTypename::VariableTypename(const VariableTypename &typename_) :
            VariableTypename{typename_.m_identifier} {
    }